

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

Matrix3d * Util::matPOW(Matrix3d *__return_storage_ptr__,Matrix3d *mat,int n)

{
  long lVar1;
  int i;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_38;
  
  pdVar3 = (double *)mat;
  pdVar4 = (double *)__return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  for (iVar2 = 1; iVar2 < n; iVar2 = iVar2 + 1) {
    local_38.m_lhs = __return_storage_ptr__;
    local_38.m_rhs = mat;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              (__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d matPOW(Eigen::Matrix3d mat, int n){

		//initialize
		Eigen::Matrix3d out = mat;

		//cycle
		for (int i = 1; i < n; ++i)	{
			out = out*mat;
		}

		return out;

	}